

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

float Abc_NtkDelayTraceLut(Abc_Ntk_t *pNtk,int fUseLutLib)

{
  long *plVar1;
  Abc_Ntk_t *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  void *local_148;
  int pPinPerm [32];
  float pPinDelays [32];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcSpeedup.c"
                  ,0x6f,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
  }
  bVar3 = true;
  lVar17 = 0;
  if ((fUseLutLib == 0) || (local_148 = Abc_FrameReadLibLut(), local_148 == (void *)0x0)) {
    local_148 = (void *)0x0;
  }
  else {
    iVar16 = *(int *)((long)local_148 + 8);
    iVar4 = Abc_NtkGetFaninMax(pNtk);
    if (iVar16 < iVar4) {
      uVar6 = *(uint *)((long)local_148 + 8);
      uVar5 = Abc_NtkGetFaninMax(pNtk);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar6,
             (ulong)uVar5);
      return -1e+09;
    }
    bVar3 = false;
  }
  free(pNtk->pLutTimes);
  uVar6 = pNtk->vObjs->nSize;
  pfVar7 = (float *)malloc((long)(int)uVar6 * 0xc);
  pNtk->pLutTimes = pfVar7;
  uVar11 = 0;
  if (0 < (int)uVar6) {
    uVar11 = (ulong)uVar6;
  }
  for (; uVar11 * 0xc - lVar17 != 0; lVar17 = lVar17 + 0xc) {
    *(undefined4 *)((long)pfVar7 + lVar17 + 8) = 0;
    *(undefined8 *)((long)pfVar7 + lVar17) = 0x4e6e6b2800000000;
  }
  pVVar8 = Abc_NtkDfs(pNtk,1);
  for (iVar16 = 0; iVar16 < pVVar8->nSize; iVar16 = iVar16 + 1) {
    pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,iVar16);
    if (bVar3) {
      uVar6 = (pAVar9->vFanins).nSize;
      uVar11 = 0;
      if (0 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
      }
      fVar18 = -1e+09;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        plVar1 = (long *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
        fVar19 = *(float *)(*(long *)(*plVar1 + 400) + (long)(int)plVar1[2] * 0xc);
        fVar20 = fVar19 + 1.0;
        if (fVar19 + 1.0 <= fVar18) {
          fVar20 = fVar18;
        }
        fVar18 = fVar20;
      }
    }
    else {
      uVar6 = (pAVar9->vFanins).nSize;
      pfVar7 = (float *)((long)local_148 + (long)(int)uVar6 * 0x84 + 0x94);
      if (*(int *)((long)local_148 + 0xc) == 0) {
        uVar11 = 0;
        if (0 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        fVar18 = -1e+09;
        for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
          plVar1 = (long *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[uVar13]];
          fVar19 = *(float *)(*(long *)(*plVar1 + 400) + (long)(int)plVar1[2] * 0xc) + *pfVar7;
          if (fVar19 <= fVar18) {
            fVar19 = fVar18;
          }
          fVar18 = fVar19;
        }
      }
      else {
        Abc_NtkDelayTraceSortPins(pAVar9,pPinPerm,pPinDelays);
        uVar6 = (pAVar9->vFanins).nSize;
        uVar11 = 0;
        if (0 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        fVar18 = -1e+09;
        for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
          plVar1 = (long *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[pPinPerm[uVar13]]];
          fVar19 = *(float *)(*(long *)(*plVar1 + 400) + (long)(int)plVar1[2] * 0xc) +
                   pfVar7[uVar13];
          if (fVar19 <= fVar18) {
            fVar19 = fVar18;
          }
          fVar18 = fVar19;
        }
      }
    }
    fVar19 = 0.0;
    if (uVar6 != 0) {
      fVar19 = fVar18;
    }
    pAVar9->pNtk->pLutTimes[(long)pAVar9->Id * 3] = fVar19;
  }
  Vec_PtrFree(pVVar8);
  fVar18 = -1e+09;
  for (iVar16 = 0; iVar4 = pNtk->vCos->nSize, iVar16 < iVar4; iVar16 = iVar16 + 1) {
    pAVar9 = Abc_NtkCo(pNtk,iVar16);
    plVar1 = (long *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
    fVar19 = *(float *)(*(long *)(*plVar1 + 400) + (long)(int)plVar1[2] * 0xc);
    if (fVar19 <= fVar18) {
      fVar19 = fVar18;
    }
    fVar18 = fVar19;
  }
  for (iVar16 = 0; iVar16 < iVar4; iVar16 = iVar16 + 1) {
    pAVar9 = Abc_NtkCo(pNtk,iVar16);
    plVar1 = (long *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
    lVar17 = *(long *)(*plVar1 + 400);
    lVar12 = (long)(int)plVar1[2];
    if (fVar18 < *(float *)(lVar17 + 4 + lVar12 * 0xc)) {
      *(float *)(lVar17 + 4 + lVar12 * 0xc) = fVar18;
    }
    iVar4 = pNtk->vCos->nSize;
  }
  pVVar8 = Abc_NtkDfsReverse(pNtk);
  uVar11 = 0;
  iVar16 = 0;
  while( true ) {
    if (pVVar8->nSize <= iVar16) {
      Vec_PtrFree(pVVar8);
      return fVar18;
    }
    pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,iVar16);
    if (bVar3) {
      pAVar2 = pAVar9->pNtk;
      pfVar10 = pAVar2->pLutTimes;
      lVar17 = (long)pAVar9->Id * 3;
      fVar19 = pfVar10[(long)pAVar9->Id * 3 + 1];
      uVar6 = (pAVar9->vFanins).nSize;
      uVar13 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar13 = uVar11;
      }
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        plVar1 = (long *)pAVar2->vObjs->pArray[(pAVar9->vFanins).pArray[uVar14]];
        lVar12 = *(long *)(*plVar1 + 400);
        lVar15 = (long)(int)plVar1[2];
        if (fVar19 + -1.0 < *(float *)(lVar12 + 4 + lVar15 * 0xc)) {
          *(float *)(lVar12 + 4 + lVar15 * 0xc) = fVar19 + -1.0;
        }
      }
    }
    else {
      uVar6 = (pAVar9->vFanins).nSize;
      pfVar7 = (float *)((long)local_148 + (long)(int)uVar6 * 0x84 + 0x94);
      if (*(int *)((long)local_148 + 0xc) == 0) {
        pAVar2 = pAVar9->pNtk;
        pfVar10 = pAVar2->pLutTimes;
        lVar17 = (long)pAVar9->Id * 3;
        fVar19 = pfVar10[(long)pAVar9->Id * 3 + 1] - *pfVar7;
        uVar13 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar13 = uVar11;
        }
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          plVar1 = (long *)pAVar2->vObjs->pArray[(pAVar9->vFanins).pArray[uVar14]];
          lVar12 = *(long *)(*plVar1 + 400);
          lVar15 = (long)(int)plVar1[2];
          if (fVar19 < *(float *)(lVar12 + 4 + lVar15 * 0xc)) {
            *(float *)(lVar12 + 4 + lVar15 * 0xc) = fVar19;
          }
        }
      }
      else {
        Abc_NtkDelayTraceSortPins(pAVar9,pPinPerm,pPinDelays);
        uVar6 = (pAVar9->vFanins).nSize;
        uVar13 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar13 = uVar11;
        }
        pAVar2 = pAVar9->pNtk;
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          fVar19 = pAVar2->pLutTimes[(long)pAVar9->Id * 3 + 1] - pfVar7[uVar14];
          plVar1 = (long *)pAVar2->vObjs->pArray[(pAVar9->vFanins).pArray[pPinPerm[uVar14]]];
          lVar17 = *(long *)(*plVar1 + 400);
          lVar12 = (long)(int)plVar1[2];
          if (fVar19 < *(float *)(lVar17 + 4 + lVar12 * 0xc)) {
            *(float *)(lVar17 + 4 + lVar12 * 0xc) = fVar19;
          }
        }
        pfVar10 = pAVar2->pLutTimes;
        lVar17 = (long)pAVar9->Id * 3;
      }
    }
    fVar19 = pfVar10[lVar17 + 1] - pfVar10[lVar17];
    if (fVar19 + 0.001 <= 0.0) break;
    fVar20 = 0.0;
    if (0.0 <= fVar19) {
      fVar20 = fVar19;
    }
    pfVar10[lVar17 + 2] = fVar20;
    iVar16 = iVar16 + 1;
  }
  __assert_fail("tSlack + 0.001 > 0.0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcSpeedup.c"
                ,0xe2,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
}

Assistant:

float Abc_NtkDelayTraceLut( Abc_Ntk_t * pNtk, int fUseLutLib )
{
    int fUseSorting = 1;
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    float tArrival, tRequired, tSlack, * pDelays;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return -ABC_INFINITY;
    }

    // initialize the arrival times
    ABC_FREE( pNtk->pLutTimes );
    pNtk->pLutTimes = ABC_ALLOC( float, 3 * Abc_NtkObjNumMax(pNtk) );
    for ( i = 0; i < Abc_NtkObjNumMax(pNtk); i++ )
    {
        pNtk->pLutTimes[3*i+0] = pNtk->pLutTimes[3*i+2] = 0;
        pNtk->pLutTimes[3*i+1] = ABC_INFINITY;
    }

    // propagate arrival times
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        tArrival = -ABC_INFINITY;
        if ( pLutLib == NULL )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + 1.0 )
                    tArrival = Abc_ObjArrival(pFanin) + 1.0;
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[0] )
                    tArrival = Abc_ObjArrival(pFanin) + pDelays[0];
        }
        else
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k ) 
                    if ( tArrival < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] )
                        tArrival = Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k];
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                    if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[k] )
                        tArrival = Abc_ObjArrival(pFanin) + pDelays[k];
            }
        }
        if ( Abc_ObjFaninNum(pNode) == 0 )
            tArrival = 0.0;
        Abc_ObjSetArrival( pNode, tArrival );
    }
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrival = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( tArrival < Abc_ObjArrival(Abc_ObjFanin0(pNode)) )
            tArrival = Abc_ObjArrival(Abc_ObjFanin0(pNode));

    // initialize the required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( Abc_ObjRequired(Abc_ObjFanin0(pNode)) > tArrival )
            Abc_ObjSetRequired( Abc_ObjFanin0(pNode), tArrival );

    // propagate the required times
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pLutLib == NULL )
        {
            tRequired = Abc_ObjRequired(pNode) - (float)1.0;
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            tRequired = Abc_ObjRequired(pNode) - pDelays[0];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else 
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(Abc_ObjFanin(pNode,pPinPerm[k])) > tRequired )
                        Abc_ObjSetRequired( Abc_ObjFanin(pNode,pPinPerm[k]), tRequired );
                }
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(pFanin) > tRequired )
                        Abc_ObjSetRequired( pFanin, tRequired );
                }
            }
        }
        // set slack for this object
        tSlack = Abc_ObjRequired(pNode) - Abc_ObjArrival(pNode);
        assert( tSlack + 0.001 > 0.0 );
        Abc_ObjSetSlack( pNode, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_PtrFree( vNodes );
    return tArrival;
}